

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O2

void __thiscall
for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
::test_method(for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> num_simplices_by_dim;
  vector<unsigned_long,_std::allocator<unsigned_long>_> num_simplices_by_dim_until_two;
  shared_count sStack_158;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *local_150;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
  *local_148;
  undefined8 *local_140;
  pointer local_138;
  char *local_130;
  pointer local_128;
  anon_class_8_1_65c67687 lambda_nb_simp_by_dim;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> st;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::clog,"TEST FOR_EACH ITERATION SKIP MECHANISM");
  std::endl<char,std::char_traits<char>>(poVar2);
  st.nodes_label_to_list_._M_h._M_buckets = &st.nodes_label_to_list_._M_h._M_single_bucket;
  st.nodes_label_to_list_._M_h._M_bucket_count = 1;
  st.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  st.nodes_label_to_list_._M_h._M_element_count = 0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  st.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  st.null_vertex_ = -1;
  st.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
        *)0x0;
  st.root_.parent_ = -1;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  st.dimension_ = -1;
  st.dimension_to_be_lowered_ = false;
  num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x100000002;
  num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_148 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
               *)0x3;
  local_150 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&num_simplices_by_dim;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
             &num_simplices_by_dim_until_two,(initializer_list<int> *)&st,
             (Filtration_value *)&local_150);
  num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_148 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
               *)0x2;
  local_150 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&num_simplices_by_dim;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
             &num_simplices_by_dim_until_two,(initializer_list<int> *)&st,
             (Filtration_value *)&local_150);
  num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_400000003;
  num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 5;
  local_148 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
               *)0x3;
  local_150 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&num_simplices_by_dim;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
             &num_simplices_by_dim_until_two,(initializer_list<int> *)&st,
             (Filtration_value *)&local_150);
  num_simplices_by_dim_until_two.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  num_simplices_by_dim_until_two.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x700000006;
  local_148 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
               *)0x4;
  local_150 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
              &num_simplices_by_dim_until_two;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&num_simplices_by_dim,
             (initializer_list<int> *)&st,(Filtration_value *)&local_150);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&num_simplices_by_dim_until_two,2,(allocator_type *)&local_150);
  lambda_nb_simp_by_dim.num_simplices_by_dim_until_two = &num_simplices_by_dim_until_two;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  for_each_simplex<for_each_simplex_skip_iteration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>::test_method()::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int)_1_&>
            (&st,&lambda_nb_simp_by_dim);
  puVar1 = num_simplices_by_dim_until_two.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = num_simplices_by_dim_until_two.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices_by_dimension
            (&num_simplices_by_dim,&st);
  puVar1 = (pointer)CONCAT44(num_simplices_by_dim.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,
                             num_simplices_by_dim.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish._0_4_);
  for (puVar3 = num_simplices_by_dim.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x4cd);
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_130 = "num_simplices_by_dim_until_two[0] == num_simplices_by_dim[0]";
  local_128 = (pointer)0x194e5e;
  local_148 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
               *)((ulong)local_148 & 0xffffffffffffff00);
  local_150 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
              &PTR__lazy_ostream_001c1f38;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_58 = "";
  local_138 = (pointer)&local_130;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_158);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_68 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x4ce);
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_130 = "num_simplices_by_dim_until_two[1] == num_simplices_by_dim[1]";
  local_128 = (pointer)0x194e9b;
  local_148 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
               *)((ulong)local_148 & 0xffffffffffffff00);
  local_150 = (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)
              &PTR__lazy_ostream_001c1f38;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = (pointer)&local_130;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_158);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&num_simplices_by_dim.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&num_simplices_by_dim_until_two.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree(&st);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(for_each_simplex_skip_iteration, typeST, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST FOR_EACH ITERATION SKIP MECHANISM" << std::endl;
  typeST st;

  st.insert_simplex_and_subfaces({2, 1, 0}, 3.);
  st.insert_simplex_and_subfaces({3, 0}, 2.);
  st.insert_simplex_and_subfaces({3, 4, 5}, 3.);
  st.insert_simplex_and_subfaces({0, 1, 6, 7}, 4.);

  /* Inserted simplex:        */
  /*    1   6                 */
  /*    o---o                 */
  /*   /X\7/                  */
  /*  o---o---o---o           */
  /*  2   0   3\X/4           */
  /*            o             */
  /*            5             */

  std::vector<size_t> num_simplices_by_dim_until_two(2);
  auto lambda_nb_simp_by_dim = [&num_simplices_by_dim_until_two](typename typeST::Simplex_handle, int dim)
                                  {
                                    BOOST_CHECK (dim < 2);
                                    ++num_simplices_by_dim_until_two[dim];
                                    return dim >= 1; // The iteration will skip the children in this case
                                  };
  st.for_each_simplex(lambda_nb_simp_by_dim);
  for (auto num_simplices : num_simplices_by_dim_until_two)
    std::cout << num_simplices << ", ";
  std::cout << std::endl;

  auto num_simplices_by_dim = st.num_simplices_by_dimension();
  for (auto num_simplices : num_simplices_by_dim)
    std::cout << num_simplices << ", ";
  std::cout << std::endl;

  BOOST_CHECK(num_simplices_by_dim_until_two[0] == num_simplices_by_dim[0]);
  BOOST_CHECK(num_simplices_by_dim_until_two[1] == num_simplices_by_dim[1]);
}